

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageHandler.cpp
# Opt level: O2

int __thiscall ImageHandler::preProcess(ImageHandler *this,string *inFile,string *targetName)

{
  char cVar1;
  int iVar2;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [96];
  
  std::__cxx11::string::string(local_a0,(inFile->_M_dataplus)._M_p,&local_a1);
  cv::imread(local_80,(int)local_a0);
  cv::Mat::operator=(&this->m_img,(Mat *)local_80);
  cv::Mat::~Mat((Mat *)local_80);
  std::__cxx11::string::~string(local_a0);
  cVar1 = cv::Mat::empty();
  if (cVar1 == '\0') {
    std::__cxx11::string::_M_assign((string *)&this->m_targetName);
    iVar2 = 0;
  }
  else {
    fprintf(_stderr,"cv::imread %s failed\n",(inFile->_M_dataplus)._M_p);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int ImageHandler::preProcess(const std::string &inFile, const std::string &targetName) 
{
    m_img = cv::imread(inFile.c_str(), 1);
    if (m_img.empty()) 
    {
        fprintf(stderr, "cv::imread %s failed\n", inFile.c_str());
        return -1;
    }

    m_targetName = targetName;
    return 0;
}